

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::transfer_densities_and_conserve_coarsen
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2verts,Adj *keys2doms,
               LOs *prods2new_ents,LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  array<bool,_3UL> *this;
  OpConservation op_conservation_00;
  bool bVar1;
  Int ent_dim;
  Int IVar2;
  LO LVar3;
  int size_in;
  TagBase *tag;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pCVar7;
  reference pvVar8;
  Read<int> local_418;
  Read<int> local_408;
  undefined1 local_3f8 [8];
  OpConservation op_conservation;
  Read<int> local_3d8;
  Read<int> local_3c8;
  Write<double> local_3b8;
  Cavs local_3a8;
  undefined1 local_368 [8];
  Cavs color_cavs;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  Cavs local_300;
  Write<double> local_2c0;
  Cavs local_2b0;
  allocator local_269;
  string local_268 [32];
  undefined1 local_248 [8];
  Write<double> new_elem_densities_w;
  Int ncomps;
  TagBase *tagbase;
  Int i;
  Int dim;
  Cavs local_210;
  undefined1 local_1d0 [8];
  CavsByBdryStatus cavs;
  Adj bdry_keys2doms;
  Read<int> local_b8 [2];
  Read<int> local_98;
  undefined1 local_88 [8];
  Cavs init_cavs;
  LOs keys2prods;
  LOs *prods2new_ents_local;
  Adj *keys2doms_local;
  LOs *keys2verts_local;
  Mesh *new_mesh_local;
  TransferOpts *opts_local;
  Mesh *old_mesh_local;
  
  bVar1 = has_densities_or_conserved(old_mesh,opts);
  if (bVar1) {
    Read<int>::Read((Read<int> *)&init_cavs.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)keys2doms);
    Read<int>::Read(&local_98,keys2verts);
    Read<int>::Read(local_b8,(Read<int> *)
                             &init_cavs.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&bdry_keys2doms.codes.write_.shared_alloc_.direct_ptr,
                    prods2new_ents);
    form_initial_cavs((Cavs *)local_88,old_mesh,new_mesh,0,&local_98,local_b8,
                      (LOs *)&bdry_keys2doms.codes.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&bdry_keys2doms.codes.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read(local_b8);
    Read<int>::~Read(&local_98);
    Adj::Adj((Adj *)&cavs._M_elems[2]._M_elems[2].
                     super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,keys2doms);
    Cavs::Cavs(&local_210,(Cavs *)local_88);
    Read<int>::Read((Read<int> *)&i,keys2verts);
    separate_cavities((CavsByBdryStatus *)local_1d0,old_mesh,new_mesh,&local_210,0,(LOs *)&i,
                      (Graph *)&cavs._M_elems[2]._M_elems[2].
                                super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    Read<int>::~Read((Read<int> *)&i);
    Cavs::~Cavs(&local_210);
    ent_dim = Mesh::dim(old_mesh);
    for (tagbase._0_4_ = 0; IVar2 = Mesh::ntags(old_mesh,ent_dim), (int)tagbase < IVar2;
        tagbase._0_4_ = (int)tagbase + 1) {
      tag = Mesh::get_tag(old_mesh,ent_dim,(int)tagbase);
      bVar1 = should_conserve(old_mesh,opts,ent_dim,tag);
      if ((bVar1) || (bVar1 = is_density(old_mesh,opts,ent_dim,tag), bVar1)) {
        new_elem_densities_w.shared_alloc_.direct_ptr._4_4_ = TagBase::ncomps(tag);
        LVar3 = Mesh::nelems(new_mesh);
        size_in = LVar3 * new_elem_densities_w.shared_alloc_.direct_ptr._4_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_268,"",&local_269);
        Write<double>::Write((Write<double> *)local_248,size_in,(string *)local_268);
        std::__cxx11::string::~string(local_268);
        std::allocator<char>::~allocator((allocator<char> *)&local_269);
        pvVar4 = std::
                 array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
                 ::operator[]((array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
                               *)local_1d0,0);
        pvVar5 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::
                 operator[](pvVar4,0);
        pvVar6 = std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::operator[](pvVar5,0);
        Cavs::Cavs(&local_2b0,pvVar6);
        Write<double>::Write(&local_2c0,(Write<double> *)local_248);
        transfer_by_intersection(old_mesh,new_mesh,tag,&local_2b0,&local_2c0);
        Write<double>::~Write(&local_2c0);
        Cavs::~Cavs(&local_2b0);
        pvVar4 = std::
                 array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
                 ::operator[]((array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
                               *)local_1d0,1);
        pvVar5 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::
                 operator[](pvVar4,0);
        pvVar6 = std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::operator[](pvVar5,0);
        Cavs::Cavs(&local_300,pvVar6);
        Write<double>::Write((Write<double> *)&__range3,(Write<double> *)local_248);
        transfer_by_intersection(old_mesh,new_mesh,tag,&local_300,(Write<double> *)&__range3);
        Write<double>::~Write((Write<double> *)&__range3);
        Cavs::~Cavs(&local_300);
        pvVar4 = std::
                 array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
                 ::operator[]((array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
                               *)local_1d0,2);
        pvVar5 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::
                 operator[](pvVar4,1);
        __end3 = std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::begin(pvVar5);
        color_cavs.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
             (void *)std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::end(pvVar5);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<Omega_h::Cavs_*,_std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>_>
                                           *)&color_cavs.keys2new_elems.ab2b.write_.shared_alloc_.
                                              direct_ptr), bVar1) {
          pCVar7 = __gnu_cxx::
                   __normal_iterator<Omega_h::Cavs_*,_std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>_>
                   ::operator*(&__end3);
          Cavs::Cavs((Cavs *)local_368,pCVar7);
          Cavs::Cavs(&local_3a8,(Cavs *)local_368);
          Write<double>::Write(&local_3b8,(Write<double> *)local_248);
          transfer_by_intersection(old_mesh,new_mesh,tag,&local_3a8,&local_3b8);
          Write<double>::~Write(&local_3b8);
          Cavs::~Cavs(&local_3a8);
          Cavs::~Cavs((Cavs *)local_368);
          __gnu_cxx::
          __normal_iterator<Omega_h::Cavs_*,_std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>_>
          ::operator++(&__end3);
        }
        Read<int>::Read(&local_3c8,same_ents2old_ents);
        Read<int>::Read(&local_3d8,same_ents2new_ents);
        Write<double>::Write
                  ((Write<double> *)(op_conservation.momentum.this_time._M_elems + 2),
                   (Write<double> *)local_248);
        transfer_common2<double>
                  (old_mesh,new_mesh,ent_dim,&local_3c8,&local_3d8,tag,
                   (Write<double> *)(op_conservation.momentum.this_time._M_elems + 2));
        Write<double>::~Write((Write<double> *)(op_conservation.momentum.this_time._M_elems + 2));
        Read<int>::~Read(&local_3d8);
        Read<int>::~Read(&local_3c8);
        Write<double>::~Write((Write<double> *)local_248);
      }
    }
    bVar1 = should_conserve_any(old_mesh,opts);
    if (bVar1) {
      OpConservation::OpConservation((OpConservation *)local_3f8);
      pvVar8 = std::array<bool,_3UL>::operator[]((array<bool,_3UL> *)local_3f8,0);
      *pvVar8 = true;
      pvVar8 = std::array<bool,_3UL>::operator[]((array<bool,_3UL> *)local_3f8,1);
      *pvVar8 = true;
      pvVar8 = std::array<bool,_3UL>::operator[]((array<bool,_3UL> *)local_3f8,2);
      *pvVar8 = false;
      this = (array<bool,_3UL> *)(local_3f8 + 6);
      pvVar8 = std::array<bool,_3UL>::operator[](this,0);
      *pvVar8 = false;
      pvVar8 = std::array<bool,_3UL>::operator[](this,1);
      *pvVar8 = false;
      pvVar8 = std::array<bool,_3UL>::operator[](this,2);
      *pvVar8 = false;
      Read<int>::Read(&local_408,same_ents2old_ents);
      Read<int>::Read(&local_418,same_ents2new_ents);
      op_conservation_00.momentum.this_time._M_elems[2] =
           op_conservation.density.this_time._M_elems[0];
      op_conservation_00.momentum.always._M_elems[0] = op_conservation.density.this_time._M_elems[1]
      ;
      op_conservation_00.momentum.always._M_elems[1] = op_conservation.density.this_time._M_elems[2]
      ;
      op_conservation_00.momentum.always._M_elems[2] = op_conservation.density.always._M_elems[0];
      op_conservation_00.density.this_time._M_elems[0] = (bool)local_3f8[0];
      op_conservation_00.density.this_time._M_elems[1] = (bool)local_3f8[1];
      op_conservation_00.density.this_time._M_elems[2] = (bool)local_3f8[2];
      op_conservation_00.density.always._M_elems[0] = (bool)local_3f8[3];
      op_conservation_00.density.always._M_elems[1] = (bool)local_3f8[4];
      op_conservation_00.density.always._M_elems[2] = (bool)local_3f8[5];
      op_conservation_00.momentum.this_time._M_elems[0] = (bool)local_3f8[6];
      op_conservation_00.momentum.this_time._M_elems[1] = (bool)local_3f8[7];
      transfer_conservation_errors
                (old_mesh,opts,new_mesh,(CavsByBdryStatus *)local_1d0,&local_408,&local_418,
                 op_conservation_00);
      Read<int>::~Read(&local_418);
      Read<int>::~Read(&local_408);
    }
    op_conservation.density.always._M_elems[2] = false;
    op_conservation.momentum.this_time._M_elems[0] = false;
    op_conservation.momentum.this_time._M_elems[1] = false;
    op_conservation.density.always._M_elems[1] = !bVar1;
    std::array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
    ~array((array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
            *)local_1d0);
    Adj::~Adj((Adj *)&cavs._M_elems[2]._M_elems[2].
                      super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    Cavs::~Cavs((Cavs *)local_88);
    Read<int>::~Read((Read<int> *)&init_cavs.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr);
  }
  return;
}

Assistant:

void transfer_densities_and_conserve_coarsen(Mesh* old_mesh,
    TransferOpts const& opts, Mesh* new_mesh, LOs keys2verts, Adj keys2doms,
    LOs prods2new_ents, LOs same_ents2old_ents, LOs same_ents2new_ents) {
  if (!has_densities_or_conserved(old_mesh, opts)) return;
  auto keys2prods = keys2doms.a2ab;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, VERT, keys2verts, keys2prods, prods2new_ents);
  auto bdry_keys2doms = keys2doms;
  auto cavs = separate_cavities(
      old_mesh, new_mesh, init_cavs, VERT, keys2verts, &bdry_keys2doms);
  auto dim = old_mesh->dim();
  for (Int i = 0; i < old_mesh->ntags(dim); ++i) {
    auto tagbase = old_mesh->get_tag(dim, i);
    if (should_conserve(old_mesh, opts, dim, tagbase) ||
        is_density(old_mesh, opts, dim, tagbase)) {
      auto ncomps = tagbase->ncomps();
      auto new_elem_densities_w = Write<Real>(new_mesh->nelems() * ncomps);
      transfer_by_intersection(old_mesh, new_mesh, tagbase,
          cavs[NOT_BDRY][NO_COLOR][0], new_elem_densities_w);
      transfer_by_intersection(old_mesh, new_mesh, tagbase,
          cavs[TOUCH_BDRY][NO_COLOR][0], new_elem_densities_w);
      for (auto color_cavs : cavs[KEY_BDRY][CLASS_COLOR]) {
        transfer_by_intersection(
            old_mesh, new_mesh, tagbase, color_cavs, new_elem_densities_w);
      }
      transfer_common2(old_mesh, new_mesh, dim, same_ents2old_ents,
          same_ents2new_ents, tagbase, new_elem_densities_w);
    }
  }
  if (!should_conserve_any(old_mesh, opts)) return;
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = false;
  op_conservation.momentum.this_time[NOT_BDRY] = false;
  op_conservation.momentum.this_time[TOUCH_BDRY] = false;
  op_conservation.momentum.this_time[KEY_BDRY] = false;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}